

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall
crnlib::mip_level::assign
          (mip_level *this,image_u8 *p,pixel_format fmt,orientation_flags_t orient_flags)

{
  bool bVar1;
  uint uVar2;
  component_flags cVar3;
  orientation_flags_t in_ECX;
  pixel_format pVar4;
  pixel_format in_EDX;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  uint in_stack_ffffffffffffffdc;
  
  clear((mip_level *)in_RDI);
  *(image<crnlib::color_quad<unsigned_char,_int>_> **)&in_RDI->m_comp_flags = in_RSI;
  uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(in_RSI);
  in_RDI->m_width = uVar2;
  uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(in_RSI);
  in_RDI->m_height = uVar2;
  *(orientation_flags_t *)&(in_RDI->m_pixel_buf).m_p = in_ECX;
  if (in_EDX == PIXEL_FMT_INVALID) {
    bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_grayscale
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x1676b0);
    if (bVar1) {
      bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid
                        (in_RDI,in_stack_ffffffffffffffdc);
      pVar4 = PIXEL_FMT_L8;
      if (bVar1) {
        pVar4 = PIXEL_FMT_A8L8;
      }
      in_RDI->m_total = pVar4;
    }
    else {
      bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid
                        (in_RDI,in_stack_ffffffffffffffdc);
      pVar4 = PIXEL_FMT_R8G8B8;
      if (bVar1) {
        pVar4 = PIXEL_FMT_A8R8G8B8;
      }
      in_RDI->m_total = pVar4;
    }
  }
  else {
    in_RDI->m_total = in_EDX;
  }
  cVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(in_RSI);
  in_RDI->m_pitch = cVar3;
  return;
}

Assistant:

void mip_level::assign(image_u8* p, pixel_format fmt, orientation_flags_t orient_flags) {
  CRNLIB_ASSERT(p);

  clear();

  m_pImage = p;

  m_width = p->get_width();
  m_height = p->get_height();
  m_orient_flags = orient_flags;

  if (fmt != PIXEL_FMT_INVALID)
    m_format = fmt;
  else {
    if (p->is_grayscale())
      m_format = p->is_component_valid(3) ? PIXEL_FMT_A8L8 : PIXEL_FMT_L8;
    else
      m_format = p->is_component_valid(3) ? PIXEL_FMT_A8R8G8B8 : PIXEL_FMT_R8G8B8;
  }

  m_comp_flags = p->get_comp_flags();  //pixel_format_helpers::get_component_flags(m_format);
}